

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_setup_connection(connectdata *conn)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  char cVar3;
  char *pcVar4;
  
  pCVar2 = conn->data;
  conn->socktype = 2;
  pcVar4 = strstr((pCVar2->state).up.path,";mode=");
  if ((pcVar4 == (char *)0x0) &&
     (pcVar4 = strstr((conn->host).rawalloc,";mode="), pcVar4 == (char *)0x0)) {
    return CURLE_OK;
  }
  *pcVar4 = '\0';
  cVar3 = Curl_raw_toupper(pcVar4[6]);
  if ((cVar3 == 'N') || (cVar3 == 'A')) {
    puVar1 = &(pCVar2->set).field_0x889;
    *puVar1 = *puVar1 | 8;
  }
  else {
    puVar1 = &(pCVar2->set).field_0x889;
    *puVar1 = *puVar1 & 0xf7;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_setup_connection(struct connectdata * conn)
{
  struct Curl_easy *data = conn->data;
  char *type;

  conn->socktype = SOCK_DGRAM;   /* UDP datagram based */

  /* TFTP URLs support an extension like ";mode=<typecode>" that
   * we'll try to get now! */
  type = strstr(data->state.up.path, ";mode=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";mode=");

  if(type) {
    char command;
    *type = 0;                   /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
    case 'N': /* NETASCII mode */
      data->set.prefer_ascii = TRUE;
      break;

    case 'O': /* octet mode */
    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->set.prefer_ascii = FALSE;
      break;
    }
  }

  return CURLE_OK;
}